

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

bool google::protobuf::internal::DateTimeToSeconds(DateTime *time,int64 *seconds)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  
  uVar1 = time->year;
  if (0xffffd8f0 < uVar1 - 10000) {
    uVar3 = time->month;
    if (0xfffffff3 < uVar3 - 0xd) {
      bVar2 = false;
      if ((((0xffffffe0 < time->day - 0x20U) && ((uint)time->hour < 0x18)) &&
          ((uint)time->minute < 0x3c)) && ((uint)time->second < 0x3c)) {
        if ((uVar3 == 2) &&
           (((uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b ||
            (((uVar1 & 3) == 0 && (uVar1 != (uVar1 / 100) * 100)))))) {
          iVar11 = *(int *)((anonymous_namespace)::kDaysInMonth + (ulong)uVar3 * 4) + 1;
        }
        else {
          iVar11 = *(int *)((anonymous_namespace)::kDaysInMonth + (ulong)uVar3 * 4);
        }
        bVar2 = time->day <= iVar11;
      }
      goto LAB_0018212c;
    }
  }
  bVar2 = false;
LAB_0018212c:
  if (bVar2 == false) {
    return false;
  }
  uVar3 = uVar1 - 1;
  if (uVar3 < 9999) {
    if ((int)uVar1 < 0x191) {
      uVar3 = 1;
      lVar7 = 0;
    }
    else {
      lVar7 = ((ulong)uVar3 / 400) * 0x2f0605980;
      uVar3 = (uVar3 / 400) * 400 + 1;
    }
    if (99 < (int)(uVar1 - uVar3)) {
      iVar11 = uVar3 - 0x12d;
      iVar12 = -uVar3;
      do {
        lVar6 = 0xbc17c200;
        if (iVar11 + (uVar3 / 400) * -400 < 0xfffffed4) {
          lVar6 = 0xbc191380;
        }
        lVar7 = lVar7 + lVar6;
        uVar3 = uVar3 + 100;
        iVar8 = iVar12 + -100;
        iVar5 = iVar12 + uVar1;
        iVar11 = iVar11 + 100;
        iVar12 = iVar8;
      } while (99 < iVar5 + -100);
      uVar3 = -iVar8;
    }
    if (3 < (int)(uVar1 - uVar3)) {
      iVar12 = uVar3 - 0x18d;
      iVar11 = uVar3 - 0x61;
      iVar5 = -uVar3;
      do {
        if ((0xffffff9f < iVar11 + (uVar3 / 100) * -100) ||
           (lVar6 = 0x784ce00, iVar12 + (uVar3 / 400) * -400 < 0xfffffe74)) {
          lVar6 = 0x7861f80;
        }
        lVar7 = lVar7 + lVar6;
        uVar3 = uVar3 + 4;
        iVar12 = iVar12 + 4;
        iVar9 = iVar5 + -4;
        iVar8 = iVar5 + uVar1;
        iVar11 = iVar11 + 4;
        iVar5 = iVar9;
      } while (3 < iVar8 + -4);
      uVar3 = -iVar9;
    }
    uVar4 = uVar3;
    if ((int)uVar3 < (int)uVar1) {
      do {
        lVar6 = 0x1e28500;
        if ((((uVar3 / 400) * 400 != uVar3) && (lVar6 = 0x1e13380, (uVar3 & 3) == 0)) &&
           (lVar6 = 0x1e28500, uVar3 == (uVar3 / 100) * 100)) {
          lVar6 = 0x1e13380;
        }
        lVar7 = lVar7 + lVar6;
        uVar3 = uVar3 + 1;
        uVar4 = uVar1;
      } while (uVar1 != uVar3);
    }
    uVar1 = time->month;
    uVar10 = (ulong)uVar1;
    if (uVar1 - 1 < 0xc) {
      lVar7 = (long)*(int *)((anonymous_namespace)::kDaysSinceJan + uVar10 * 4) * 0x15180 + lVar7;
      if (2 < (int)uVar1) {
        uVar3 = uVar4 * -0x3d70a3d7 + 0x51eb850;
        if ((uVar3 >> 4 | uVar4 * -0x70000000) < 0xa3d70b) {
          bVar13 = true;
        }
        else if ((uVar4 & 3) == 0) {
          bVar13 = 0x28f5c28 < (uVar3 >> 2 | uVar4 * 0x40000000);
        }
        else {
          bVar13 = false;
        }
        if (bVar13) {
          lVar7 = lVar7 + 0x15180;
        }
      }
      iVar11 = time->day;
      if (0 < (long)iVar11) {
        if ((uVar1 == 2) &&
           (((uVar4 * -0x3d70a3d7 + 0x51eb850 >> 4 | uVar4 * -0x70000000) < 0xa3d70b ||
            (((uVar4 & 3) == 0 && (uVar4 != ((int)uVar4 / 100) * 100)))))) {
          iVar12 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar10 * 4) + 1;
        }
        else {
          iVar12 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar10 * 4);
        }
        if (iVar11 <= iVar12) {
          *seconds = (long)time->second +
                     (long)time->minute * 0x3c + (long)time->hour * 0xe10 + (long)iVar11 * 0x15180 +
                     -0xe77934880 + lVar7;
          return bVar2;
        }
      }
      __assert_fail("time.day >= 1 && time.day <= (month == 2 && IsLeapYear(year) ? kDaysInMonth[month] + 1 : kDaysInMonth[month])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/time.cc"
                    ,0x7b,
                    "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                   );
    }
    __assert_fail("time.month >= 1 && time.month <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/time.cc"
                  ,0x72,
                  "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                 );
  }
  __assert_fail("time.year >= 1 && time.year <= 9999",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/time.cc"
                ,0x5e,
                "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
               );
}

Assistant:

bool DateTimeToSeconds(const DateTime& time, int64* seconds) {
  if (!ValidateDateTime(time)) {
    return false;
  }
  *seconds = SecondsSinceCommonEra(time) - kSecondsFromEraToEpoch;
  return true;
}